

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AZHighLevelEncoder.cpp
# Opt level: O3

bool ZXing::Aztec::IsBetterThanOrEqualTo(EncodingState *state,EncodingState *other)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar2 = (int)*(short *)((long)state->mode * 0x14 + 0x192da2 + (long)other->mode * 4) +
          state->bitCount;
  iVar1 = state->binaryShiftByteCount;
  iVar4 = other->binaryShiftByteCount;
  if (iVar1 < iVar4) {
    iVar3 = 0x15;
    if (((iVar4 < 0x3f) && (iVar3 = 0x14, iVar4 < 0x20)) && (iVar3 = 10, iVar4 < 1)) {
      iVar3 = 0;
    }
    iVar4 = -0x15;
    if ((iVar1 < 0x3f) && (iVar4 = -0x14, iVar1 < 0x20)) {
      iVar4 = -10;
      if (iVar1 < 1) {
        iVar4 = 0;
      }
    }
    iVar3 = iVar3 + iVar2 + iVar4;
  }
  else {
    iVar3 = iVar2 + 10;
    if (iVar4 < 1) {
      iVar3 = iVar2;
    }
    if (iVar1 <= iVar4) {
      iVar3 = iVar2;
    }
  }
  return iVar3 <= other->bitCount;
}

Assistant:

static bool IsBetterThanOrEqualTo(const EncodingState& state, const EncodingState& other)
{
	int newModeBitCount = state.bitCount + (LATCH_TABLE[state.mode][other.mode] >> 16);
	if (state.binaryShiftByteCount < other.binaryShiftByteCount) {
		// add additional B/S encoding cost of other, if any
		newModeBitCount += CalculateBinaryShiftCost(other) - CalculateBinaryShiftCost(state);
	}
	else if (state.binaryShiftByteCount > other.binaryShiftByteCount && other.binaryShiftByteCount > 0) {
		// maximum possible additional cost (we end up exceeding the 31 byte boundary and other state can stay beneath it)
		newModeBitCount += 10;
	}
	return newModeBitCount <= other.bitCount;
}